

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O0

int Fra_ImpRefineUsingCex(Fra_Man_t *p,Vec_Int_t *vImps)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  int i_00;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int local_34;
  int local_30;
  int RetValue;
  int i;
  int Imp;
  Aig_Obj_t *pRight;
  Aig_Obj_t *pLeft;
  Vec_Int_t *vImps_local;
  Fra_Man_t *p_local;
  
  local_34 = 0;
  for (local_30 = 0; iVar2 = Vec_IntSize(vImps), local_30 < iVar2; local_30 = local_30 + 1) {
    iVar2 = Vec_IntEntry(vImps,local_30);
    if (iVar2 != 0) {
      pAVar1 = p->pManAig;
      i_00 = Fra_ImpLeft(iVar2);
      pAVar3 = Aig_ManObj(pAVar1,i_00);
      pAVar1 = p->pManAig;
      iVar2 = Fra_ImpRight(iVar2);
      pAVar4 = Aig_ManObj(pAVar1,iVar2);
      iVar2 = Sml_NodeCheckImp(p->pSml,pAVar3->Id,pAVar4->Id);
      if (iVar2 == 0) {
        Vec_IntWriteEntry(vImps,local_30,0);
        local_34 = 1;
      }
    }
  }
  return local_34;
}

Assistant:

int Fra_ImpRefineUsingCex( Fra_Man_t * p, Vec_Int_t * vImps )
{
    Aig_Obj_t * pLeft, * pRight;
    int Imp, i, RetValue = 0;
    Vec_IntForEachEntry( vImps, Imp, i )
    {
        if ( Imp == 0 )
            continue;
        // get the corresponding nodes
        pLeft = Aig_ManObj( p->pManAig, Fra_ImpLeft(Imp) );
        pRight = Aig_ManObj( p->pManAig, Fra_ImpRight(Imp) );
        // check if implication holds using this simulation info
        if ( !Sml_NodeCheckImp(p->pSml, pLeft->Id, pRight->Id) )
        {
            Vec_IntWriteEntry( vImps, i, 0 );
            RetValue = 1;
        }
    }
    return RetValue;
}